

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_tuple.hpp
# Opt level: O1

void __thiscall
burst::dynamic_tuple::push_back<(anonymous_namespace)::dummy>(dynamic_tuple *this,dummy *object)

{
  ulong uVar1;
  char *pcVar2;
  dummy *object_00;
  ulong uVar3;
  dummy *creation_place;
  dummy *extraout_RDX;
  ulong new_capacity;
  
  uVar1 = this->m_capacity;
  uVar3 = this->m_volume;
  creation_place =
       (dummy *)((this->m_data)._M_t.
                 super___uniq_ptr_impl<signed_char,_std::default_delete<signed_char[]>_>._M_t.
                 super__Tuple_impl<0UL,_signed_char_*,_std::default_delete<signed_char[]>_>.
                 super__Head_base<0UL,_signed_char_*,_false>._M_head_impl + uVar3);
  object_00 = (dummy *)0x0;
  if (uVar1 != uVar3) {
    object_00 = creation_place;
  }
  if (object_00 == (dummy *)0x0) {
    uVar3 = uVar3 + 2;
    if (uVar1 < uVar3) {
      new_capacity = uVar1 * 2;
      if (uVar1 * 2 <= uVar3) {
        new_capacity = uVar3;
      }
      reallocate(this,new_capacity);
      creation_place = extraout_RDX;
    }
    if ((this->m_capacity == this->m_volume) ||
       (pcVar2 = (this->m_data)._M_t.
                 super___uniq_ptr_impl<signed_char,_std::default_delete<signed_char[]>_>._M_t.
                 super__Tuple_impl<0UL,_signed_char_*,_std::default_delete<signed_char[]>_>.
                 super__Head_base<0UL,_signed_char_*,_false>._M_head_impl, pcVar2 == (char *)0x0)) {
      __assert_fail("creation_place != nullptr",
                    "/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/include/burst/container/dynamic_tuple.hpp"
                    ,0x1c5,
                    "std::int8_t *burst::dynamic_tuple::force_align(const T &) [T = (anonymous namespace)::dummy]"
                   );
    }
    object_00 = (dummy *)(pcVar2 + this->m_volume);
  }
  accomodate<(anonymous_namespace)::dummy>(this,object_00,&creation_place->alive);
  return;
}

Assistant:

void push_back (T && object)
        {
            auto creation_place = set_up_creation_place(object);
            accomodate(std::forward<T>(object), creation_place);
        }